

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-process-title.c
# Opt level: O1

int run_test_process_title_big_argv(void)

{
  uv_loop_t **buffer;
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  uv_loop_t *puVar2;
  uv_loop_t *loop;
  int extraout_EDX;
  void **ppvVar3;
  uv_handle_t *puVar4;
  int64_t eval_b_1;
  int64_t eval_a_1;
  size_t exepath_size;
  uv_process_t process;
  char *args [5];
  uv_process_options_t options;
  char jumbo [512];
  char exepath [1024];
  uv_handle_t auStack_840 [4];
  uv_loop_t *puStack_738;
  undefined8 uStack_728;
  code *pcStack_720;
  void *local_718;
  undefined1 local_710 [16];
  uv_process_t local_700;
  uv_loop_t *local_698;
  char *local_690;
  long *local_688;
  long *local_680;
  undefined8 local_678;
  uv_process_options_t local_668;
  long local_618 [63];
  undefined1 local_419;
  uv_loop_t local_418;
  
  ppvVar3 = &local_718;
  local_710._8_8_ = (uv_loop_t *)0x3ff;
  loop = &local_418;
  pcStack_720 = (code *)0x1b3a04;
  iVar1 = uv_exepath((char *)loop,(size_t *)(local_710 + 8));
  local_618[0] = (long)iVar1;
  local_700.data = (void *)0x0;
  if (local_618[0] == 0) {
    *(undefined1 *)((long)(local_710._8_8_ + 0x38) + (long)(local_418.reserved + -0xe)) = 0;
    pcStack_720 = (code *)0x1b3a54;
    memset(local_618,0x78,0x1ff);
    local_419 = 0;
    local_668.args = (char **)&local_698;
    local_690 = "process_title_big_argv_helper";
    local_678 = 0;
    local_668.env = (char **)0x0;
    local_668.cwd = (char *)0x0;
    local_668.flags = 0;
    local_668.stdio_count = 0;
    local_668.stdio = (uv_stdio_container_t *)0x0;
    local_668.uid = 0;
    local_668.gid = 0;
    local_668.cpumask = (char *)0x0;
    local_668.cpumask_size = 0;
    local_668.exit_cb = exit_cb;
    pcStack_720 = (code *)0x1b3ab7;
    local_698 = loop;
    local_688 = local_618;
    local_680 = local_618;
    local_668.file = (char *)loop;
    puVar2 = uv_default_loop();
    pcStack_720 = (code *)0x1b3ac7;
    iVar1 = uv_spawn(puVar2,&local_700,&local_668);
    local_710._0_8_ = SEXT48(iVar1);
    local_718 = (void *)0x0;
    if ((void *)local_710._0_8_ != (void *)0x0) goto LAB_001b3b7a;
    pcStack_720 = (code *)0x1b3ae6;
    puVar2 = uv_default_loop();
    pcStack_720 = (code *)0x1b3af0;
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    local_710._0_8_ = SEXT48(iVar1);
    local_718 = (void *)0x0;
    if ((void *)local_710._0_8_ == (void *)0x0) {
      pcStack_720 = (code *)0x1b3b0f;
      loop = uv_default_loop();
      pcStack_720 = (code *)0x1b3b23;
      uv_walk(loop,close_walk_cb,(void *)0x0);
      pcStack_720 = (code *)0x1b3b2d;
      uv_run(loop,UV_RUN_DEFAULT);
      local_710._0_8_ = (void *)0x0;
      pcStack_720 = (code *)0x1b3b3b;
      puVar2 = uv_default_loop();
      pcStack_720 = (code *)0x1b3b43;
      iVar1 = uv_loop_close(puVar2);
      local_718 = (void *)(long)iVar1;
      if ((void *)local_710._0_8_ == local_718) {
        pcStack_720 = (code *)0x1b3b59;
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001b3b94;
    }
  }
  else {
    pcStack_720 = (code *)0x1b3b7a;
    run_test_process_title_big_argv_cold_1();
LAB_001b3b7a:
    pcStack_720 = (code *)0x1b3b87;
    run_test_process_title_big_argv_cold_2();
  }
  pcStack_720 = (code *)0x1b3b94;
  run_test_process_title_big_argv_cold_3();
LAB_001b3b94:
  puVar4 = (uv_handle_t *)local_710;
  pcStack_720 = exit_cb;
  run_test_process_title_big_argv_cold_4();
  uStack_728 = 0;
  if (ppvVar3 == (void **)0x0) {
    pcStack_720 = (code *)(long)extraout_EDX;
    uStack_728 = 0;
    if (pcStack_720 == (code *)0x0) {
      uv_close(puVar4,(uv_close_cb)0x0);
      return extraout_EAX;
    }
  }
  else {
    puStack_738 = (uv_loop_t *)0x1b3bf6;
    pcStack_720 = (code *)ppvVar3;
    exit_cb_cold_1();
  }
  puStack_738 = (uv_loop_t *)process_title_big_argv;
  exit_cb_cold_2();
  buffer = &auStack_840[0].loop;
  puStack_738 = loop;
  memset(buffer,0,0x100);
  auStack_840[0].loop._0_4_ = 0x6c696166;
  uv_get_process_title((char *)buffer,0x100);
  auStack_840[0].data = (void *)0x0;
  iVar1 = strcmp((char *)buffer,"fail");
  if (auStack_840[0].data != (void *)(long)iVar1) {
    return (int)auStack_840[0].data;
  }
  puVar4 = auStack_840;
  process_title_big_argv_cold_1();
  iVar1 = uv_is_closing(puVar4);
  if (iVar1 != 0) {
    return iVar1;
  }
  uv_close(puVar4,(uv_close_cb)0x0);
  return extraout_EAX_00;
}

Assistant:

TEST_IMPL(process_title_big_argv) {
  uv_process_options_t options;
  uv_process_t process;
  size_t exepath_size;
  char exepath[1024];
  char jumbo[512];
  char* args[5];

#ifdef _WIN32
  /* Remove once https://github.com/libuv/libuv/issues/2667 is fixed. */
  uv_set_process_title("run-tests");
#endif

  exepath_size = sizeof(exepath) - 1;
  ASSERT_OK(uv_exepath(exepath, &exepath_size));
  exepath[exepath_size] = '\0';

  memset(jumbo, 'x', sizeof(jumbo) - 1);
  jumbo[sizeof(jumbo) - 1] = '\0';

  /* Note: need to pass three arguments, not two, otherwise
   * run-tests.c thinks it's the name of a test to run.
   */
  args[0] = exepath;
  args[1] = "process_title_big_argv_helper";
  args[2] = jumbo;
  args[3] = jumbo;
  args[4] = NULL;

  memset(&options, 0, sizeof(options));
  options.file = exepath;
  options.args = args;
  options.exit_cb = exit_cb;

  ASSERT_OK(uv_spawn(uv_default_loop(), &process, &options));
  ASSERT_OK(uv_run(uv_default_loop(), UV_RUN_DEFAULT));

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}